

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O1

bool IncludeByVariable(cmExecutionStatus *status,string *variable)

{
  cmMakefile *this;
  bool bVar1;
  cmValue in_path;
  string *in_base;
  bool bVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string includeFile;
  string local_88;
  string local_68;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  size_type local_38;
  pointer local_30;
  
  this = status->Makefile;
  in_path = cmMakefile::GetDefinition(this,variable);
  if (in_path.Value == (string *)0x0) {
    return true;
  }
  in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath(&local_68,in_path.Value,in_base);
  bVar1 = cmsys::SystemTools::FileExists(&local_68);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsDirectory(&local_68);
    if (bVar1) {
      local_30 = ((in_path.Value)->_M_dataplus)._M_p;
      local_38 = (in_path.Value)->_M_string_length;
      local_48._M_len = 0x21;
      local_48._M_str = "requested file is a directory:\n  ";
      views._M_len = 2;
      views._M_array = &local_48;
      cmCatViews_abi_cxx11_(&local_88,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      bVar1 = cmMakefile::ReadDependentFile(this,in_path.Value,true);
      bVar2 = true;
      if (((bVar1) || (cmSystemTools::s_FatalErrorOccurred != false)) ||
         (bVar1 = cmSystemTools::GetInterruptFlag(), bVar1)) goto LAB_00346de7;
      local_30 = ((in_path.Value)->_M_dataplus)._M_p;
      local_38 = (in_path.Value)->_M_string_length;
      local_48._M_len = 0x21;
      local_48._M_str = "could not load requested file:\n  ";
      views_01._M_len = 2;
      views_01._M_array = &local_48;
      cmCatViews_abi_cxx11_(&local_88,views_01);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  else {
    local_30 = ((in_path.Value)->_M_dataplus)._M_p;
    local_38 = (in_path.Value)->_M_string_length;
    local_48._M_len = 0x21;
    local_48._M_str = "could not find requested file:\n  ";
    views_00._M_len = 2;
    views_00._M_array = &local_48;
    cmCatViews_abi_cxx11_(&local_88,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_00346de7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

static bool IncludeByVariable(cmExecutionStatus& status,
                              const std::string& variable)
{
  cmMakefile& mf = status.GetMakefile();
  cmValue include = mf.GetDefinition(variable);
  if (!include) {
    return true;
  }

  std::string includeFile =
    cmSystemTools::CollapseFullPath(*include, mf.GetCurrentSourceDirectory());
  if (!cmSystemTools::FileExists(includeFile)) {
    status.SetError(cmStrCat("could not find requested file:\n  ", *include));
    return false;
  }
  if (cmSystemTools::FileIsDirectory(includeFile)) {
    status.SetError(cmStrCat("requested file is a directory:\n  ", *include));
    return false;
  }

  const bool readit = mf.ReadDependentFile(*include);
  if (readit) {
    return true;
  }

  if (cmSystemTools::GetFatalErrorOccurred()) {
    return true;
  }

  status.SetError(cmStrCat("could not load requested file:\n  ", *include));
  return false;
}